

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O3

int __thiscall Random_keys::avancaGeracoes(Random_keys *this,Graph *g)

{
  double *pdVar1;
  pointer ppRVar2;
  RK_Individual *pRVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  Random_keys *this_00;
  long lVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  double local_68;
  
  uVar11 = (long)this->tamPop - 1;
  ppRVar2 = (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3) <= uVar11) {
LAB_00106c7c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
  }
  pRVar3 = ppRVar2[(long)this->tamPop + -1];
  ordenaPopulacaoAtual(this,g);
  if (this->numGeracoes < 1) {
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    iVar15 = 0;
    local_68 = pRVar3->active_loss * 100000.0;
    do {
      ordenaPopulacaoAtual(this,g);
      uVar11 = (long)this->tamPop - 1;
      ppRVar2 = (this->popAtual).
                super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3) <= uVar11)
      goto LAB_00106c7c;
      dVar21 = ppRVar2[(long)this->tamPop + -1]->active_loss * 100000.0;
      if (dVar21 < local_68) {
        iVar14 = iVar15;
      }
      std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
                (&this->popAnterior,&this->popAtual);
      dVar20 = (double)this->tamPop;
      uVar10 = (uint)(dVar20 * 0.05);
      iVar19 = (int)(dVar20 * 0.1);
      if ((int)uVar10 < this->tamPop - iVar19) {
        uVar16 = (ulong)(int)uVar10;
        do {
          iVar6 = rand();
          iVar6 = iVar6 % this->tamPop;
          iVar7 = rand();
          iVar7 = iVar7 % this->tamPop;
          iVar8 = rand();
          iVar8 = iVar8 % this->tamPop;
          iVar9 = rand();
          iVar9 = iVar9 % this->tamPop;
          uVar17 = (ulong)iVar7;
          this_00 = (Random_keys *)
                    (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = (long)(this->popAnterior).
                         super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3;
          uVar11 = uVar17;
          if ((uVar13 <= uVar17) || (uVar11 = (ulong)iVar8, uVar13 <= uVar11)) goto LAB_00106c7c;
          dVar20 = *(double *)(*(long *)(&this_00->numGeracoes + uVar11 * 2) + 0x10);
          pdVar1 = (double *)(*(long *)(&this_00->numGeracoes + uVar17 * 2) + 0x10);
          if (*pdVar1 <= dVar20 && dVar20 != *pdVar1) {
            iVar8 = iVar7;
          }
          uVar17 = (ulong)iVar8;
          uVar11 = uVar17;
          if ((uVar13 <= uVar17) || (uVar11 = (ulong)iVar9, uVar13 <= uVar11)) goto LAB_00106c7c;
          dVar20 = *(double *)(*(long *)(&this_00->numGeracoes + uVar11 * 2) + 0x10);
          pdVar1 = (double *)(*(long *)(&this_00->numGeracoes + uVar17 * 2) + 0x10);
          if (*pdVar1 <= dVar20 && dVar20 != *pdVar1) {
            iVar9 = iVar8;
          }
          if (iVar9 == iVar6) {
            do {
              iVar9 = rand();
              iVar9 = iVar9 % this->tamPop;
            } while (iVar9 == iVar6);
            this_00 = (Random_keys *)
                      (this->popAnterior).
                      super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar13 = (long)(this->popAnterior).
                           super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3;
          }
          uVar17 = (ulong)iVar6;
          uVar11 = uVar17;
          if (((uVar13 <= uVar17) || (uVar12 = (ulong)iVar9, uVar11 = uVar12, uVar13 <= uVar12)) ||
             (ppRVar2 = (this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_start, uVar11 = uVar16,
             (ulong)((long)(this->popAtual).
                           super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3) <= uVar16
             )) goto LAB_00106c7c;
          pRVar3 = ppRVar2[uVar16];
          iVar8 = pRVar3->number_of_edges;
          if (0 < (long)iVar8) {
            lVar4 = *(long *)(*(long *)(&this_00->numGeracoes + uVar17 * 2) + 8);
            lVar5 = *(long *)(*(long *)(&this_00->numGeracoes + uVar12 * 2) + 8);
            this_00 = (Random_keys *)pRVar3->weights;
            lVar18 = 0;
            do {
              *(double *)(&this_00->numGeracoes + lVar18 * 2) =
                   (*(double *)(lVar4 + lVar18 * 8) + *(double *)(lVar5 + lVar18 * 8)) * 0.5;
              lVar18 = lVar18 + 1;
            } while (iVar8 != lVar18);
          }
          mutacao(this_00,pRVar3);
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)this->tamPop - (long)iVar19);
      }
      if (0 < (int)uVar10) {
        uVar11 = 0;
        do {
          ppRVar2 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->popAtual).
                            super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3) <=
              uVar11) goto LAB_00106c7c;
          RK_Individual::generate_random_weights(ppRVar2[uVar11]);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (local_68 <= dVar21) {
        dVar21 = local_68;
      }
      iVar15 = iVar15 + 1;
      local_68 = dVar21;
    } while (iVar15 < this->numGeracoes);
  }
  ordenaPopulacaoAtual(this,g);
  return iVar14;
}

Assistant:

int Random_keys::avancaGeracoes(Graph *g){

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
        e ordena a populacao da maior perda(pior individuo)
        pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /**torneio com 3**/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento1(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();
            this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

    this->ordenaPopulacaoAtual(g);

    return melhorGeracao;
}